

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O3

void QGraphicsRotation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QVector3D *axis;
  undefined8 *puVar1;
  code *pcVar2;
  long lVar3;
  int iVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      iVar4 = 2;
    }
    else if (_id == 1) {
      iVar4 = 1;
    }
    else {
      if (_id != 0) {
        return;
      }
      iVar4 = 0;
    }
    QMetaObject::activate(_o,&staticMetaObject,iVar4,(void **)0x0);
    return;
  case ReadProperty:
    puVar1 = (undefined8 *)*_a;
    if (_id == 2) {
      uVar5 = *(undefined8 *)(*(long *)(_o + 8) + 0x98);
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0xa0);
LAB_0062be0c:
      *puVar1 = uVar5;
      *(undefined4 *)(puVar1 + 1) = uVar6;
      return;
    }
    if (_id == 1) {
      *puVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x90);
    }
    else if (_id == 0) {
      uVar5 = *(undefined8 *)(*(long *)(_o + 8) + 0x80);
      uVar6 = *(undefined4 *)(*(long *)(_o + 8) + 0x88);
      goto LAB_0062be0c;
    }
    break;
  case WriteProperty:
    axis = (QVector3D *)*_a;
    if (_id == 2) {
      setAxis((QGraphicsRotation *)_o,axis);
      return;
    }
    if (_id == 1) {
      setAngle((QGraphicsRotation *)_o,*(qreal *)axis->v);
      return;
    }
    if (_id == 0) {
      setOrigin((QGraphicsRotation *)_o,axis);
      return;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == originChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
      return;
    }
    if (pcVar2 == angleChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
      return;
    }
    if (pcVar2 == axisChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsRotation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsRotation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->originChanged(); break;
        case 1: _t->angleChanged(); break;
        case 2: _t->axisChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::originChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::angleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::axisChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVector3D*>(_v) = _t->origin(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->angle(); break;
        case 2: *reinterpret_cast<QVector3D*>(_v) = _t->axis(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrigin(*reinterpret_cast<QVector3D*>(_v)); break;
        case 1: _t->setAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setAxis(*reinterpret_cast<QVector3D*>(_v)); break;
        default: break;
        }
    }
}